

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O3

void __thiscall ezc3d::c3d::parameter(c3d *this,string *groupName,Parameter *p)

{
  int iVar1;
  string *psVar2;
  size_t idx;
  Group *this_00;
  invalid_argument *this_01;
  
  psVar2 = ParametersNS::GroupNS::Parameter::name_abi_cxx11_(p);
  iVar1 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar1 != 0) {
    idx = ParametersNS::Parameters::groupIdx
                    ((this->_parameters).
                     super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,groupName);
    this_00 = ParametersNS::Parameters::group
                        ((this->_parameters).
                         super___shared_ptr<ezc3d::ParametersNS::Parameters,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,idx);
    ParametersNS::GroupNS::Group::parameter(this_00,p);
    updateHeader(this);
    return;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"Parameter must have a name");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void ezc3d::c3d::parameter(const std::string &groupName,
                           const ezc3d::ParametersNS::GroupNS::Parameter &p) {
  if (!p.name().compare("")) {
    throw std::invalid_argument("Parameter must have a name");
  }

  size_t idx;
  try {
    idx = parameters().groupIdx(groupName);
  } catch (const std::invalid_argument&) {
    _parameters->group(ezc3d::ParametersNS::GroupNS::Group(groupName));
    idx = parameters().groupIdx(groupName);
  }

  _parameters->group(idx).parameter(p);

  // Do a sanity check on the header if important stuff like number
  // of frames or number of elements is changed
  updateHeader();
}